

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O3

void __thiscall NNTreeImpl::repair(NNTreeImpl *this)

{
  QPDFObjectHandle *this_00;
  undefined8 uVar1;
  string *psVar2;
  _List_node_base *p_Var3;
  long *plVar4;
  QPDFObjectHandle new_node;
  iterator __begin1;
  iterator __end1;
  undefined1 local_1d0 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  QPDFObjectHandle local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  QPDFObjectHandle local_138;
  NNTreeImpl local_128;
  NNTreeIterator local_f0;
  iterator local_90;
  
  QPDFObjectHandle::newDictionary();
  psVar2 = (string *)(*(code *)**(undefined8 **)this->details)();
  QPDFObjectHandle::newArray();
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_1d0,psVar2,(QPDFObjectHandle *)local_198);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
  }
  local_128.details = this->details;
  local_128.qpdf = this->qpdf;
  local_128.split_threshold = 0x20;
  local_128.oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_1d0._0_8_;
  local_128.oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_1d0._8_8_ + 8) = *(_Atomic_word *)(local_1d0._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_1d0._8_8_ + 8) = *(_Atomic_word *)(local_1d0._8_8_ + 8) + 1;
    }
  }
  local_128.auto_repair = false;
  begin((iterator *)local_198,this);
  local_f0._vptr_NNTreeIterator = (_func_int **)&PTR__NNTreeIterator_002eb170;
  local_f0.impl = this;
  local_f0.path.
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_f0.path;
  local_f0.path.
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_f0.path;
  local_f0.path.
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node._M_size = 0;
  local_f0.node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_f0.node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0.item_number = 0xffffffff;
  local_f0.ivalue.first.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_f0.ivalue.first.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0.ivalue.second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_f0.ivalue.second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1d0._16_8_ = this;
  do {
    if ((local_188._40_4_ & local_f0.item_number) == 0xffffffff) {
LAB_0012ebf7:
      NNTreeIterator::~NNTreeIterator(&local_f0);
      NNTreeIterator::~NNTreeIterator((NNTreeIterator *)local_198);
      local_198._0_8_ = (element_type *)local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"/Kids","");
      local_f0._vptr_NNTreeIterator = (_func_int **)&local_f0.path;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/Kids","");
      QPDFObjectHandle::getKey(&local_138,(string *)local_1d0);
      this_00 = (QPDFObjectHandle *)(local_1d0._16_8_ + 0x18);
      QPDFObjectHandle::replaceKey(this_00,(string *)local_198,&local_138);
      if (local_138.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_138.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *)
          local_f0._vptr_NNTreeIterator != &local_f0.path) {
        operator_delete(local_f0._vptr_NNTreeIterator,
                        (ulong)((long)&(((_List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                                          *)&(local_f0.path.
                                              super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                                              ._M_impl._M_node.super__List_node_base._M_next)->
                                             _M_next)->_M_impl)._M_node.super__List_node_base.
                                       _M_next + 1));
      }
      uVar1 = local_1d0._16_8_;
      if ((element_type *)local_198._0_8_ != (element_type *)local_188) {
        operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
      }
      psVar2 = (string *)(**(code **)**(undefined8 **)uVar1)();
      (**(code **)**(undefined8 **)uVar1)();
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_198,(string *)local_1d0);
      QPDFObjectHandle::replaceKey(this_00,psVar2,(QPDFObjectHandle *)local_198);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
      }
      if (local_128.oh.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.oh.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
      }
      return;
    }
    if (local_188._16_8_ ==
        local_f0.path.
        super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
        _M_impl._M_node._M_size) {
      p_Var3 = (_List_node_base *)&local_f0.path;
      plVar4 = (long *)local_188;
      do {
        plVar4 = (long *)*plVar4;
        if (plVar4 == (long *)local_188) {
          if (local_188._40_4_ == local_f0.item_number) goto LAB_0012ebf7;
          break;
        }
        p_Var3 = (((_List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                    *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (*(int *)(plVar4 + 4) == *(int *)(p_Var3 + 2));
    }
    NNTreeIterator::updateIValue((NNTreeIterator *)local_198,false);
    local_1a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_188._48_8_;
    local_1a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_150._M_pi;
    if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
      }
    }
    local_1d0._24_8_ = local_148._M_pi;
    local_1b0 = local_140._M_pi;
    if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_140._M_pi)->_M_use_count = (local_140._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_140._M_pi)->_M_use_count = (local_140._M_pi)->_M_use_count + 1;
      }
    }
    insert(&local_90,&local_128,&local_1a8,(QPDFObjectHandle *)(local_1d0 + 0x18));
    NNTreeIterator::~NNTreeIterator(&local_90);
    if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0);
    }
    if (local_1a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    NNTreeIterator::increment((NNTreeIterator *)local_198,false);
  } while( true );
}

Assistant:

void
NNTreeImpl::repair()
{
    auto new_node = QPDFObjectHandle::newDictionary();
    new_node.replaceKey(details.itemsKey(), QPDFObjectHandle::newArray());
    NNTreeImpl repl(details, qpdf, new_node, false);
    for (auto const& i: *this) {
        repl.insert(i.first, i.second);
    }
    this->oh.replaceKey("/Kids", new_node.getKey("/Kids"));
    this->oh.replaceKey(details.itemsKey(), new_node.getKey(details.itemsKey()));
}